

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_generic-inl.h
# Opt level: O2

int google::GetStackTrace(void **result,int max_depth,int skip_count)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  void *stack [64];
  
  iVar1 = backtrace(stack,0x40);
  uVar4 = ~skip_count + iVar1;
  uVar2 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  if (max_depth <= (int)uVar4) {
    uVar4 = max_depth;
  }
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = (ulong)uVar4;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    result[uVar2] = stack[(long)skip_count + uVar2 + 1];
  }
  return uVar4;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  static const int kStackLength = 64;
  void* stack[kStackLength];
  int size;

  size = backtrace(stack, kStackLength);
  skip_count++;  // we want to skip the current frame as well
  int result_count = size - skip_count;
  if (result_count < 0) {
    result_count = 0;
  }
  if (result_count > max_depth) {
    result_count = max_depth;
  }
  for (int i = 0; i < result_count; i++) {
    result[i] = stack[i + skip_count];
  }

  return result_count;
}